

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::CompilerMSL(CompilerMSL *this,uint32_t *ir_,size_t word_count)

{
  _Rb_tree_header *p_Var1;
  
  CompilerGLSL::CompilerGLSL(&this->super_CompilerGLSL,ir_,word_count);
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerMSL_004fb0d0;
  (this->function_global_vars)._M_h._M_buckets = &(this->function_global_vars)._M_h._M_single_bucket
  ;
  (this->function_global_vars)._M_h._M_bucket_count = 1;
  (this->function_global_vars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->function_global_vars)._M_h._M_element_count = 0;
  (this->function_global_vars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->function_global_vars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->function_global_vars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->builtin_frag_coord_id = 0;
  this->builtin_sample_id_id = 0;
  this->builtin_sample_mask_id = 0;
  this->builtin_helper_invocation_id = 0;
  this->builtin_vertex_idx_id = 0;
  this->builtin_base_vertex_id = 0;
  this->builtin_instance_idx_id = 0;
  this->builtin_base_instance_id = 0;
  this->builtin_view_idx_id = 0;
  this->builtin_layer_id = 0;
  this->builtin_invocation_id_id = 0;
  this->builtin_primitive_id_id = 0;
  this->builtin_subgroup_invocation_id_id = 0;
  this->builtin_subgroup_size_id = 0;
  this->builtin_dispatch_base_id = 0;
  this->builtin_stage_input_size_id = 0;
  this->builtin_local_invocation_index_id = 0;
  this->builtin_workgroup_size_id = 0;
  this->builtin_frag_depth_id = 0;
  this->swizzle_buffer_id = 0;
  this->buffer_size_buffer_id = 0;
  this->view_mask_buffer_id = 0;
  this->dynamic_offsets_buffer_id = 0;
  this->uint_type_id = 0;
  *(undefined8 *)((long)&this->uint_type_id + 2) = 0;
  *(undefined8 *)((long)&this->argument_buffer_padding_image_type_id + 2) = 0;
  (this->msl_options).platform = macOS;
  (this->msl_options).msl_version = 0x27d8;
  (this->msl_options).texel_buffer_texture_width = 0x1000;
  (this->msl_options).r32ui_linear_texture_alignment = 4;
  (this->msl_options).r32ui_alignment_constant_id = 0xffff;
  (this->msl_options).swizzle_buffer_index = 0x1e;
  (this->msl_options).indirect_params_buffer_index = 0x1d;
  (this->msl_options).shader_output_buffer_index = 0x1c;
  (this->msl_options).shader_patch_output_buffer_index = 0x1b;
  (this->msl_options).shader_tess_factor_buffer_index = 0x1a;
  (this->msl_options).buffer_size_buffer_index = 0x19;
  (this->msl_options).view_mask_buffer_index = 0x18;
  (this->msl_options).dynamic_offsets_buffer_index = 0x17;
  (this->msl_options).shader_input_buffer_index = 0x16;
  (this->msl_options).shader_index_buffer_index = 0x15;
  (this->msl_options).shader_patch_input_buffer_index = 0x14;
  (this->msl_options).shader_input_wg_index = 0;
  (this->msl_options).device_index = 0;
  (this->msl_options).enable_frag_output_mask = 0xffffffff;
  (this->msl_options).additional_fixed_sample_mask = 0xffffffff;
  (this->msl_options).enable_point_size_builtin = true;
  (this->msl_options).enable_frag_depth_builtin = true;
  (this->msl_options).enable_frag_stencil_ref_builtin = true;
  (this->msl_options).disable_rasterization = false;
  (this->msl_options).capture_output_to_buffer = false;
  (this->msl_options).swizzle_texture_samples = false;
  (this->msl_options).tess_domain_origin_lower_left = false;
  (this->msl_options).multiview = false;
  (this->msl_options).multiview_layered_rendering = true;
  (this->msl_options).view_index_from_device_index = false;
  (this->msl_options).dispatch_base = false;
  (this->msl_options).texture_1D_as_2D = false;
  (this->msl_options).argument_buffers = false;
  (this->msl_options).argument_buffers_tier = Tier1;
  (this->msl_options).runtime_array_rich_descriptor = false;
  (this->msl_options).enable_base_index_zero = false;
  (this->msl_options).pad_fragment_output_components = false;
  (this->msl_options).ios_support_base_vertex_instance = false;
  (this->msl_options).use_framebuffer_fetch_subpasses = false;
  (this->msl_options).invariant_float_math = false;
  (this->msl_options).emulate_cube_array = false;
  (this->msl_options).enable_decoration_binding = false;
  (this->msl_options).texture_buffer_native = false;
  (this->msl_options).force_active_argument_buffer_resources = false;
  (this->msl_options).pad_argument_buffer_resources = false;
  (this->msl_options).force_native_arrays = false;
  (this->msl_options).enable_clip_distance_user_varying = true;
  (this->msl_options).multi_patch_workgroup = false;
  (this->msl_options).raw_buffer_tese_input = false;
  (this->msl_options).vertex_for_tessellation = false;
  (this->msl_options).arrayed_subpass_input = false;
  (this->msl_options).ios_use_simdgroup_functions = false;
  (this->msl_options).emulate_subgroups = false;
  (this->msl_options).fixed_subgroup_size = 0;
  (this->msl_options).vertex_index_type = None;
  (this->msl_options).force_sample_rate_shading = false;
  (this->msl_options).manual_helper_invocation_updates = true;
  (this->msl_options).check_discarded_frag_stores = false;
  (this->msl_options).sample_dref_lod_array_as_grad = false;
  (this->msl_options).readwrite_texture_fences = true;
  (this->msl_options).replace_recursive_inputs = false;
  (this->msl_options).agx_manual_cube_grad_fixup = false;
  (this->msl_options).force_fragment_with_side_effects_execution = false;
  (this->msl_options).input_attachment_is_ds_attachment = false;
  p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputs_by_builtin)._M_h._M_buckets = &(this->inputs_by_builtin)._M_h._M_single_bucket;
  (this->inputs_by_builtin)._M_h._M_bucket_count = 1;
  (this->inputs_by_builtin)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inputs_by_builtin)._M_h._M_element_count = 0;
  (this->inputs_by_builtin)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inputs_by_builtin)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inputs_by_builtin)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->outputs_by_builtin)._M_h._M_buckets = &(this->outputs_by_builtin)._M_h._M_single_bucket;
  (this->outputs_by_builtin)._M_h._M_bucket_count = 1;
  (this->outputs_by_builtin)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->outputs_by_builtin)._M_h._M_element_count = 0;
  (this->outputs_by_builtin)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->outputs_by_builtin)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->outputs_by_builtin)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->location_inputs_in_use)._M_h._M_buckets =
       &(this->location_inputs_in_use)._M_h._M_single_bucket;
  (this->location_inputs_in_use)._M_h._M_bucket_count = 1;
  (this->location_inputs_in_use)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->location_inputs_in_use)._M_h._M_element_count = 0;
  (this->location_inputs_in_use)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->location_inputs_in_use)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->location_inputs_in_use)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->location_inputs_in_use_fallback)._M_h._M_buckets =
       &(this->location_inputs_in_use_fallback)._M_h._M_single_bucket;
  (this->location_inputs_in_use_fallback)._M_h._M_bucket_count = 1;
  (this->location_inputs_in_use_fallback)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->location_inputs_in_use_fallback)._M_h._M_element_count = 0;
  (this->location_inputs_in_use_fallback)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->location_inputs_in_use_fallback)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->location_inputs_in_use_fallback)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->location_outputs_in_use)._M_h._M_buckets =
       &(this->location_outputs_in_use)._M_h._M_single_bucket;
  (this->location_outputs_in_use)._M_h._M_bucket_count = 1;
  (this->location_outputs_in_use)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->location_outputs_in_use)._M_h._M_element_count = 0;
  (this->location_outputs_in_use)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->location_outputs_in_use)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->location_outputs_in_use)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->location_outputs_in_use_fallback)._M_h._M_buckets =
       &(this->location_outputs_in_use_fallback)._M_h._M_single_bucket;
  (this->location_outputs_in_use_fallback)._M_h._M_bucket_count = 1;
  (this->location_outputs_in_use_fallback)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->location_outputs_in_use_fallback)._M_h._M_element_count = 0;
  (this->location_outputs_in_use_fallback)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->location_outputs_in_use_fallback)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->location_outputs_in_use_fallback)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->fragment_output_components)._M_h._M_buckets =
       &(this->fragment_output_components)._M_h._M_single_bucket;
  (this->fragment_output_components)._M_h._M_bucket_count = 1;
  (this->fragment_output_components)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fragment_output_components)._M_h._M_element_count = 0;
  (this->fragment_output_components)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fragment_output_components)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fragment_output_components)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builtin_to_automatic_input_location)._M_h._M_buckets =
       &(this->builtin_to_automatic_input_location)._M_h._M_single_bucket;
  (this->builtin_to_automatic_input_location)._M_h._M_bucket_count = 1;
  (this->builtin_to_automatic_input_location)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builtin_to_automatic_input_location)._M_h._M_element_count = 0;
  (this->builtin_to_automatic_input_location)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->builtin_to_automatic_input_location)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builtin_to_automatic_input_location)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builtin_to_automatic_output_location)._M_h._M_buckets =
       &(this->builtin_to_automatic_output_location)._M_h._M_single_bucket;
  (this->builtin_to_automatic_output_location)._M_h._M_bucket_count = 1;
  (this->builtin_to_automatic_output_location)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builtin_to_automatic_output_location)._M_h._M_element_count = 0;
  (this->builtin_to_automatic_output_location)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->builtin_to_automatic_output_location)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builtin_to_automatic_output_location)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->pragma_lines)._M_t._M_impl.super__Rb_tree_header;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->typedef_lines)._M_t._M_impl.super__Rb_tree_header;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->vars_needing_early_declaration).stack_storage;
  (this->vars_needing_early_declaration).buffer_capacity = 8;
  (this->resource_bindings)._M_h._M_buckets = &(this->resource_bindings)._M_h._M_single_bucket;
  (this->resource_bindings)._M_h._M_bucket_count = 1;
  (this->resource_bindings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->resource_bindings)._M_h._M_element_count = 0;
  (this->resource_bindings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->resource_bindings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->resource_bindings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_buckets =
       &(this->resource_arg_buff_idx_to_binding_number)._M_h._M_single_bucket;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_bucket_count = 1;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_element_count = 0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->resource_arg_buff_idx_to_binding_number)._M_h._M_single_bucket + 4)
       = 0;
  this->next_metal_resource_index_texture = 0;
  this->next_metal_resource_index_sampler = 0;
  this->stage_in_var_id = 0;
  this->stage_out_var_id = 0;
  this->patch_stage_in_var_id = 0;
  this->patch_stage_out_var_id = 0;
  this->stage_in_ptr_var_id = 0;
  this->stage_out_ptr_var_id = 0;
  this->tess_level_inner_var_id = 0;
  this->tess_level_outer_var_id = 0;
  this->stage_out_masked_builtin_type_id = 0;
  this->needs_base_vertex_arg = Neutral;
  this->needs_base_instance_arg = Neutral;
  this->has_sampled_images = false;
  this->builtin_declaration = false;
  this->is_using_builtin_array = false;
  this->is_rasterization_disabled = false;
  *(undefined8 *)((long)&this->needs_base_instance_arg + 1) = 0;
  this->needs_swizzle_buffer_def = false;
  this->used_swizzle_buffer = false;
  this->added_builtin_tess_level = false;
  this->needs_subgroup_invocation_id = false;
  this->needs_subgroup_size = false;
  this->needs_sample_id = false;
  this->needs_helper_invocation = false;
  this->writes_to_depth = false;
  (this->qual_pos_var_name)._M_dataplus._M_p = (pointer)&(this->qual_pos_var_name).field_2;
  (this->qual_pos_var_name)._M_string_length = 0;
  (this->qual_pos_var_name).field_2._M_local_buf[0] = '\0';
  (this->stage_in_var_name)._M_dataplus._M_p = (pointer)&(this->stage_in_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->stage_in_var_name,"in","");
  (this->stage_out_var_name)._M_dataplus._M_p = (pointer)&(this->stage_out_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->stage_out_var_name,"out","");
  (this->patch_stage_in_var_name)._M_dataplus._M_p =
       (pointer)&(this->patch_stage_in_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->patch_stage_in_var_name,"patchIn","");
  (this->patch_stage_out_var_name)._M_dataplus._M_p =
       (pointer)&(this->patch_stage_out_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->patch_stage_out_var_name,"patchOut","");
  (this->sampler_name_suffix)._M_dataplus._M_p = (pointer)&(this->sampler_name_suffix).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->sampler_name_suffix,"Smplr","")
  ;
  (this->swizzle_name_suffix)._M_dataplus._M_p = (pointer)&(this->swizzle_name_suffix).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->swizzle_name_suffix,"Swzl","");
  (this->buffer_size_name_suffix)._M_dataplus._M_p =
       (pointer)&(this->buffer_size_name_suffix).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->buffer_size_name_suffix,"BufferSize","");
  (this->plane_name_suffix)._M_dataplus._M_p = (pointer)&(this->plane_name_suffix).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->plane_name_suffix,"Plane","");
  (this->input_wg_var_name)._M_dataplus._M_p = (pointer)&(this->input_wg_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->input_wg_var_name,"gl_in","");
  (this->input_buffer_var_name)._M_dataplus._M_p = (pointer)&(this->input_buffer_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->input_buffer_var_name,"spvIn","");
  (this->output_buffer_var_name)._M_dataplus._M_p = (pointer)&(this->output_buffer_var_name).field_2
  ;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->output_buffer_var_name,"spvOut","");
  (this->patch_input_buffer_var_name)._M_dataplus._M_p =
       (pointer)&(this->patch_input_buffer_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->patch_input_buffer_var_name,"spvPatchIn","");
  (this->patch_output_buffer_var_name)._M_dataplus._M_p =
       (pointer)&(this->patch_output_buffer_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->patch_output_buffer_var_name,"spvPatchOut","");
  (this->tess_factor_buffer_var_name)._M_dataplus._M_p =
       (pointer)&(this->tess_factor_buffer_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->tess_factor_buffer_var_name,"spvTessLevel","");
  (this->index_buffer_var_name)._M_dataplus._M_p = (pointer)&(this->index_buffer_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->index_buffer_var_name,"spvIndices","");
  this->previous_instruction_opcode = OpNop;
  p_Var1 = &(this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->constexpr_samplers_by_binding)._M_h._M_buckets =
       &(this->constexpr_samplers_by_binding)._M_h._M_single_bucket;
  (this->constexpr_samplers_by_binding)._M_h._M_bucket_count = 1;
  (this->constexpr_samplers_by_binding)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->constexpr_samplers_by_binding)._M_h._M_element_count = 0;
  (this->constexpr_samplers_by_binding)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->constexpr_samplers_by_binding)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->constexpr_samplers_by_binding)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffers_requiring_array_length)._M_h._M_buckets =
       &(this->buffers_requiring_array_length)._M_h._M_single_bucket;
  (this->buffers_requiring_array_length)._M_h._M_bucket_count = 1;
  (this->buffers_requiring_array_length)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->buffers_requiring_array_length)._M_h._M_element_count = 0;
  (this->buffers_requiring_array_length)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->buffers_requiring_array_length)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->buffers_requiring_array_length)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffer_aliases_argument).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.
  buffer_size = 0;
  (this->buffer_aliases_argument).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr =
       (pair<unsigned_int,_unsigned_int> *)&(this->buffer_aliases_argument).stack_storage;
  (this->buffer_aliases_argument).buffer_capacity = 8;
  (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->buffer_aliases_discrete).stack_storage;
  (this->buffer_aliases_discrete).buffer_capacity = 8;
  (this->atomic_image_vars_emulated)._M_h._M_buckets =
       &(this->atomic_image_vars_emulated)._M_h._M_single_bucket;
  (this->atomic_image_vars_emulated)._M_h._M_bucket_count = 1;
  (this->atomic_image_vars_emulated)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->atomic_image_vars_emulated)._M_h._M_element_count = 0;
  (this->atomic_image_vars_emulated)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->atomic_image_vars_emulated)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->atomic_image_vars_emulated)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pull_model_inputs)._M_h._M_buckets = &(this->pull_model_inputs)._M_h._M_single_bucket;
  (this->pull_model_inputs)._M_h._M_bucket_count = 1;
  (this->pull_model_inputs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pull_model_inputs)._M_h._M_element_count = 0;
  (this->pull_model_inputs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pull_model_inputs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pull_model_inputs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->recursive_inputs)._M_h._M_buckets = &(this->recursive_inputs)._M_h._M_single_bucket;
  (this->recursive_inputs)._M_h._M_bucket_count = 1;
  (this->recursive_inputs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->recursive_inputs)._M_h._M_element_count = 0;
  (this->recursive_inputs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->recursive_inputs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->recursive_inputs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = 0;
  (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr =
       (SPIRVariable **)&(this->entry_point_bindings).stack_storage;
  (this->entry_point_bindings).buffer_capacity = 8;
  p_Var1 = &(this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->disabled_frag_outputs).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->disabled_frag_outputs).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->disabled_frag_outputs).stack_storage;
  (this->disabled_frag_outputs).buffer_capacity = 8;
  (this->inline_uniform_blocks)._M_h._M_buckets =
       &(this->inline_uniform_blocks)._M_h._M_single_bucket;
  (this->inline_uniform_blocks)._M_h._M_bucket_count = 1;
  (this->inline_uniform_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inline_uniform_blocks)._M_h._M_element_count = 0;
  (this->inline_uniform_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inline_uniform_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inline_uniform_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->argument_buffer_discrete_mask = 0;
  this->argument_buffer_device_storage_mask = 0;
  this->suppress_missing_prototypes = false;
  this->suppress_incompatible_pointer_types_discard_qualifiers = false;
  return;
}

Assistant:

CompilerMSL::CompilerMSL(const uint32_t *ir_, size_t word_count)
    : CompilerGLSL(ir_, word_count)
{
}